

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::UnconnectedDriveDirectiveSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,UnconnectedDriveDirectiveSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  size_t index_local;
  UnconnectedDriveDirectiveSyntax *this_local;
  
  if (index == 0) {
    token.kind = (this->super_DirectiveSyntax).directive.kind;
    token._2_1_ = (this->super_DirectiveSyntax).directive.field_0x2;
    token.numFlags.raw = (this->super_DirectiveSyntax).directive.numFlags.raw;
    token.rawLen = (this->super_DirectiveSyntax).directive.rawLen;
    token.info = (this->super_DirectiveSyntax).directive.info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token);
  }
  else if (index == 1) {
    token_00.kind = (this->strength).kind;
    token_00._2_1_ = (this->strength).field_0x2;
    token_00.numFlags.raw = (this->strength).numFlags.raw;
    token_00.rawLen = (this->strength).rawLen;
    token_00.info = (this->strength).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_00);
  }
  else {
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax UnconnectedDriveDirectiveSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return directive;
        case 1: return strength;
        default: return nullptr;
    }
}